

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__make_close_pending(uv_handle_t *handle)

{
  if ((handle->flags & 1U) == 0) {
    __assert_fail("handle->flags & UV_CLOSING","src/unix/core.c",0x9a,
                  "void uv__make_close_pending(uv_handle_t *)");
  }
  if ((handle->flags & 2U) == 0) {
    handle->next_closing = handle->loop->closing_handles;
    handle->loop->closing_handles = handle;
    return;
  }
  __assert_fail("!(handle->flags & UV_CLOSED)","src/unix/core.c",0x9b,
                "void uv__make_close_pending(uv_handle_t *)");
}

Assistant:

void uv__make_close_pending(uv_handle_t* handle) {
  assert(handle->flags & UV_CLOSING);
  assert(!(handle->flags & UV_CLOSED));
  handle->next_closing = handle->loop->closing_handles;
  handle->loop->closing_handles = handle;
}